

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-fns.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  size_type sVar1;
  int iVar2;
  size_t i_2;
  void *__s_00;
  void *__s_01;
  undefined8 uVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  void *__s_02;
  undefined8 *puVar7;
  value_type_conflict1 *__val;
  value_type *__val_3;
  uint uVar8;
  uint uVar9;
  size_t i;
  long lVar10;
  value_type *__val_1;
  ulong uVar11;
  float fVar12;
  float fVar13;
  double sum;
  float fVar14;
  float fVar15;
  uint local_80;
  string arg;
  float local_4c;
  undefined1 local_48 [16];
  
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  if (1 < argc) {
    uVar11 = 1;
    do {
      sVar1 = arg._M_string_length;
      __s = argv[uVar11];
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&arg,0,(char *)sVar1,(ulong)__s);
      iVar2 = std::__cxx11::string::compare((char *)&arg);
      if (iVar2 != 0) {
        main_cold_1();
        uVar8 = 1;
        goto LAB_00101951;
      }
      uVar11 = uVar11 + 1;
    } while ((uint)argc != uVar11);
  }
  __s_00 = operator_new(0x4000);
  memset(__s_00,0,0x4000);
  __s_01 = operator_new(0x4000);
  lVar10 = 0;
  memset(__s_01,0,0x4000);
  do {
    fVar12 = cosf((float)lVar10);
    *(float *)((long)__s_00 + lVar10 * 4) = fVar12 + fVar12 + 0.1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x1000);
  lVar10 = 0;
  do {
    fVar12 = cosf((float)lVar10 + 1.0);
    *(float *)((long)__s_01 + lVar10 * 4) = fVar12 + fVar12 + 0.1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x1000);
  ggml_cpu_init();
  local_80 = 0;
  uVar8 = 0;
  do {
    lVar10 = ggml_get_type_traits(uVar8);
    uVar3 = ggml_get_type_traits_cpu(uVar8);
    local_48._0_8_ = uVar3;
    if (*(long *)(lVar10 + 8) != 0) {
      ggml_type_name(uVar8);
      printf("Testing %s\n");
      ggml_quantize_init(uVar8);
      if ((*(long *)local_48._0_8_ != 0) && (*(long *)(lVar10 + 0x28) != 0)) {
        pvVar4 = operator_new(0x2000);
        memset(pvVar4,0,0x2000);
        pvVar5 = operator_new(0x4000);
        memset(pvVar5,0,0x4000);
        (**(code **)local_48._0_8_)(__s_00,pvVar4,0x1000);
        (**(code **)(lVar10 + 0x28))(pvVar4,pvVar5,0x1000);
        fVar12 = 0.0;
        lVar6 = 0;
        do {
          fVar14 = *(float *)((long)__s_00 + lVar6 * 4) - *(float *)((long)pvVar5 + lVar6 * 4);
          fVar12 = fVar12 + fVar14 * fVar14;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x1000);
        if (fVar12 < 0.0) {
          fVar12 = sqrtf(fVar12);
        }
        else {
          fVar12 = SQRT(fVar12);
        }
        fVar12 = fVar12 * 0.00024414062;
        operator_delete(pvVar5,0x4000);
        operator_delete(pvVar4,0x2000);
        uVar9 = uVar8 & 0x3e;
        fVar14 = 0.01;
        if (uVar9 != 0x22) {
          if ((int)uVar8 < 0x15) {
            fVar14 = 0.0075;
            if (uVar8 != 10) {
              if (uVar8 == 0xb) goto LAB_0010156b;
LAB_00101554:
              fVar14 = *(float *)(&DAT_00102010 + (ulong)(uVar8 == 0x12) * 4);
            }
          }
          else if (uVar8 == 0x15) {
LAB_0010156b:
            fVar14 = 0.004;
          }
          else {
            fVar14 = 0.0075;
            if (uVar8 != 0x16) goto LAB_00101554;
          }
        }
        if ((1 < argc) || (fVar14 <= fVar12)) {
          uVar3 = ggml_type_name(uVar8);
          printf("%5s absolute quantization error:    %s (%f)\n",(double)fVar12,uVar3,
                 RESULT_STR[fVar14 <= fVar12]);
        }
        pvVar4 = operator_new(0x2000);
        memset(pvVar4,0,0x2000);
        pvVar5 = operator_new(0x4000);
        memset(pvVar5,0,0x4000);
        __s_02 = operator_new(0x4000);
        memset(__s_02,0,0x4000);
        (**(code **)local_48._0_8_)(__s_00,pvVar4,0x1000);
        (**(code **)(lVar10 + 0x28))(pvVar4,pvVar5,0x1000);
        (**(code **)(lVar10 + 0x30))(__s_00,pvVar4,0x1000);
        (**(code **)(lVar10 + 0x28))(pvVar4,__s_02,0x1000);
        fVar13 = 0.0;
        lVar10 = 0;
        do {
          fVar15 = *(float *)((long)pvVar5 + lVar10 * 4) - *(float *)((long)__s_02 + lVar10 * 4);
          fVar13 = fVar13 + fVar15 * fVar15;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x1000);
        if (fVar13 < 0.0) {
          fVar13 = sqrtf(fVar13);
        }
        else {
          fVar13 = SQRT(fVar13);
        }
        fVar13 = fVar13 * 0.00024414062;
        operator_delete(__s_02,0x4000);
        operator_delete(pvVar5,0x4000);
        operator_delete(pvVar4,0x2000);
        if ((1 < argc) || (0.0001 <= fVar13)) {
          uVar3 = ggml_type_name(uVar8);
          printf("%5s reference implementation error: %s (%f)\n",(double)fVar13,uVar3,
                 RESULT_STR[0.0001 <= fVar13]);
        }
        pvVar4 = operator_new(0x2000);
        memset(pvVar4,0,0x2000);
        pvVar5 = operator_new(0x2000);
        memset(pvVar5,0,0x2000);
        puVar7 = (undefined8 *)ggml_get_type_traits_cpu(*(undefined4 *)(local_48._0_8_ + 0x10));
        (**(code **)local_48._0_8_)(__s_00,pvVar4,0x1000);
        (*(code *)*puVar7)(__s_01,pvVar5,0x1000);
        local_4c = INFINITY;
        (**(code **)(local_48._0_8_ + 8))(0x1000,&local_4c,0,pvVar4,0,pvVar5,0,1);
        fVar15 = 0.0;
        lVar10 = 0;
        do {
          fVar15 = fVar15 + *(float *)((long)__s_00 + lVar10 * 4) *
                            *(float *)((long)__s_01 + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x1000);
        local_48 = ZEXT416((uint)(ABS(local_4c - fVar15) * 0.00024414062));
        operator_delete(pvVar5,0x2000);
        operator_delete(pvVar4,0x2000);
        fVar15 = 0.04;
        if ((uVar9 != 0x10) &&
           ((0x16 < uVar8 || (fVar15 = 0.04, (0x640400U >> (uVar8 & 0x1f) & 1) == 0)))) {
          fVar15 = *(float *)(&DAT_00102018 + (ulong)(uVar9 == 0x22) * 4);
        }
        local_80 = local_80 + (fVar14 <= fVar12) + (uint)(0.0001 <= fVar13) +
                   (uint)(fVar15 <= local_48._0_4_);
        if ((1 < argc) || (fVar15 <= local_48._0_4_)) {
          uVar3 = ggml_type_name(uVar8);
          printf("%5s dot product error:              %s (%f)\n",(double)(float)local_48._0_4_,uVar3
                 ,RESULT_STR[fVar15 <= (float)local_48._0_4_]);
        }
      }
    }
    uVar8 = uVar8 + 1;
    if (uVar8 == 0x27) {
      if ((1 < argc) || (local_80 != 0)) {
        printf("%d tests failed\n",(ulong)local_80);
      }
      uVar8 = (uint)(0 < (int)local_80);
      operator_delete(__s_01,0x4000);
      operator_delete(__s_00,0x4000);
LAB_00101951:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)arg._M_dataplus._M_p != &arg.field_2) {
        operator_delete(arg._M_dataplus._M_p,
                        CONCAT71(arg.field_2._M_allocated_capacity._1_7_,arg.field_2._M_local_buf[0]
                                ) + 1);
      }
      return uVar8;
    }
  } while( true );
}

Assistant:

int main(int argc, char * argv[]) {
    bool verbose = false;
    const size_t test_size = 32 * 128;

    std::string arg;
    for (int i = 1; i < argc; i++) {
        arg = argv[i];

        if (arg == "-v") {
            verbose = true;
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            return 1;
        }
    }

    std::vector<float> test_data(test_size);
    std::vector<float> test_data2(test_size);

    generate_data(0.0, test_data.size(), test_data.data());
    generate_data(1.0, test_data2.size(), test_data2.data());

    ggml_cpu_init();

    int num_failed = 0;
    bool failed = false;

    for (int i = 0; i < GGML_TYPE_COUNT; i++) {
        ggml_type type = (ggml_type) i;
        const auto * qfns = ggml_get_type_traits(type);
        const auto * qfns_cpu = ggml_get_type_traits_cpu(type);

        // deprecated - skip
        if (qfns->blck_size == 0) {
            continue;
        }

        const ggml_type ei = (ggml_type)i;

        printf("Testing %s\n", ggml_type_name((ggml_type) i));
        ggml_quantize_init(ei);

        if (qfns_cpu->from_float && qfns->to_float) {
            const float total_error = total_quantization_error(qfns, qfns_cpu, test_size, test_data.data());
            const float max_quantization_error =
                type == GGML_TYPE_TQ1_0   ? MAX_QUANTIZATION_TOTAL_ERROR_TERNARY :
                type == GGML_TYPE_TQ2_0   ? MAX_QUANTIZATION_TOTAL_ERROR_TERNARY :
                type == GGML_TYPE_Q2_K    ? MAX_QUANTIZATION_TOTAL_ERROR_2BITS :
                type == GGML_TYPE_IQ2_S   ? MAX_QUANTIZATION_TOTAL_ERROR_2BITS :
                type == GGML_TYPE_Q3_K    ? MAX_QUANTIZATION_TOTAL_ERROR_3BITS :
                type == GGML_TYPE_IQ3_S   ? MAX_QUANTIZATION_TOTAL_ERROR_3BITS :
                type == GGML_TYPE_IQ3_XXS ? MAX_QUANTIZATION_TOTAL_ERROR_3BITS_XXS : MAX_QUANTIZATION_TOTAL_ERROR;
            failed = !(total_error < max_quantization_error);
            num_failed += failed;
            if (failed || verbose) {
                printf("%5s absolute quantization error:    %s (%f)\n", ggml_type_name(type), RESULT_STR[failed], total_error);
            }

            const float reference_error = reference_quantization_error(qfns, qfns_cpu, test_size, test_data.data());
            failed = !(reference_error < MAX_QUANTIZATION_REFERENCE_ERROR);
            num_failed += failed;
            if (failed || verbose) {
                printf("%5s reference implementation error: %s (%f)\n", ggml_type_name(type), RESULT_STR[failed], reference_error);
            }

            const float vec_dot_error = dot_product_error(qfns, qfns_cpu, test_size, test_data.data(), test_data2.data());
            const float max_allowed_error = type == GGML_TYPE_Q2_K || type == GGML_TYPE_IQ2_XS || type == GGML_TYPE_IQ2_XXS ||
                                            type == GGML_TYPE_IQ3_XXS || type == GGML_TYPE_IQ3_S || type == GGML_TYPE_IQ2_S
                                          ? MAX_DOT_PRODUCT_ERROR_LOWBIT
                                          : type == GGML_TYPE_TQ1_0 || type == GGML_TYPE_TQ2_0
                                          ? MAX_DOT_PRODUCT_ERROR_TERNARY
                                          : MAX_DOT_PRODUCT_ERROR;
            failed = !(vec_dot_error < max_allowed_error);
            num_failed += failed;
            if (failed || verbose) {
                printf("%5s dot product error:              %s (%f)\n", ggml_type_name(type), RESULT_STR[failed], vec_dot_error);
            }
        }
    }

    if (num_failed || verbose) {
        printf("%d tests failed\n", num_failed);
    }

    return num_failed > 0;
}